

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::XMLScanner::scanEq(XMLScanner *this,bool inDecl)

{
  bool bVar1;
  ReaderMgr *this_00;
  undefined7 in_register_00000031;
  bool skippedSomething;
  bool local_9;
  
  this_00 = &this->fReaderMgr;
  if ((int)CONCAT71(in_register_00000031,inDecl) == 0) {
    ReaderMgr::skipPastSpaces(this_00);
    bVar1 = ReaderMgr::skippedChar(this_00,L'=');
    if (!bVar1) {
      return false;
    }
    ReaderMgr::skipPastSpaces(this_00);
  }
  else {
    ReaderMgr::skipPastSpaces(this_00,&local_9,true);
    bVar1 = ReaderMgr::skippedChar(this_00,L'=');
    if (!bVar1) {
      return false;
    }
    ReaderMgr::skipPastSpaces(this_00,&local_9,true);
  }
  return true;
}

Assistant:

bool XMLScanner::scanEq(bool inDecl)
{
    if(inDecl)
    {
        bool skippedSomething;
        fReaderMgr.skipPastSpaces(skippedSomething, inDecl);
        if (fReaderMgr.skippedChar(chEqual))
        {
            fReaderMgr.skipPastSpaces(skippedSomething, inDecl);
            return true;
        }
    }
    else
    {
        fReaderMgr.skipPastSpaces();
        if (fReaderMgr.skippedChar(chEqual))
        {
            fReaderMgr.skipPastSpaces();
            return true;
        }
    }
    return false;
}